

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

bool __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducer::new_block_index
          (ImplicitProducer *this)

{
  BlockIndexEntry *pBVar1;
  __pointer_type pBVar2;
  size_t sVar3;
  __int_type _Var4;
  BlockIndexEntry **ppBVar5;
  __pointer_type pBVar6;
  BlockIndexEntry *pBVar7;
  ulong uVar8;
  size_t sVar9;
  __int_type _Var10;
  BlockIndexEntry *pBVar11;
  size_t sVar12;
  size_t sVar13;
  
  pBVar2 = (this->blockIndex)._M_b._M_p;
  if (pBVar2 == (__pointer_type)0x0) {
    sVar13 = 0;
  }
  else {
    sVar13 = pBVar2->capacity;
  }
  sVar3 = this->nextBlockIndexCapacity;
  sVar12 = sVar13;
  if (pBVar2 == (__pointer_type)0x0) {
    sVar12 = sVar3;
  }
  pBVar6 = (__pointer_type)malloc(sVar3 * 8 + 0x36 + sVar12 * 0x10);
  if (pBVar6 != (__pointer_type)0x0) {
    uVar8 = (ulong)(-((int)pBVar6 + 0x28) & 7);
    pBVar7 = (BlockIndexEntry *)((long)&pBVar6[1].capacity + uVar8);
    pBVar1 = pBVar7 + sVar12;
    if (pBVar2 != (__pointer_type)0x0) {
      _Var4 = (pBVar2->tail).super___atomic_base<unsigned_long>._M_i;
      sVar9 = pBVar2->capacity;
      ppBVar5 = pBVar2->index;
      _Var10 = _Var4;
      pBVar11 = pBVar1;
      do {
        _Var10 = _Var10 + 1 & sVar9 - 1;
        (pBVar11->key).super___atomic_base<unsigned_long>._M_i = (__int_type)ppBVar5[_Var10];
        pBVar11 = (BlockIndexEntry *)&pBVar11->value;
      } while (_Var10 != _Var4);
    }
    pBVar11 = pBVar7;
    for (sVar9 = 0; sVar12 != sVar9; sVar9 = sVar9 + 1) {
      (pBVar11->key).super___atomic_base<unsigned_long>._M_i = 1;
      *(BlockIndexEntry **)
       ((long)&pBVar6[1].capacity + sVar9 * 8 + sVar13 * 8 + sVar12 * 0x10 + uVar8) = pBVar11;
      pBVar11 = pBVar11 + 1;
    }
    pBVar6->prev = pBVar2;
    pBVar6->entries = pBVar7;
    pBVar6->index =
         (BlockIndexEntry **)
         ((long)&(pBVar1->key).super___atomic_base<unsigned_long>._M_i + (ulong)(-(int)pBVar1 & 7));
    pBVar6->capacity = sVar3;
    (pBVar6->tail).super___atomic_base<unsigned_long>._M_i = sVar3 - 1 & sVar13 - 1;
    (this->blockIndex)._M_b._M_p = pBVar6;
    this->nextBlockIndexCapacity = sVar3 * 2;
  }
  return pBVar6 != (__pointer_type)0x0;
}

Assistant:

bool new_block_index()
		{
			auto prev = blockIndex.load(std::memory_order_relaxed);
			size_t prevCapacity = prev == nullptr ? 0 : prev->capacity;
			auto entryCount = prev == nullptr ? nextBlockIndexCapacity : prevCapacity;
			auto raw = static_cast<char*>((Traits::malloc)(
				sizeof(BlockIndexHeader) +
				std::alignment_of<BlockIndexEntry>::value - 1 + sizeof(BlockIndexEntry) * entryCount +
				std::alignment_of<BlockIndexEntry*>::value - 1 + sizeof(BlockIndexEntry*) * nextBlockIndexCapacity));
			if (raw == nullptr) {
				return false;
			}
			
			auto header = new (raw) BlockIndexHeader;
			auto entries = reinterpret_cast<BlockIndexEntry*>(details::align_for<BlockIndexEntry>(raw + sizeof(BlockIndexHeader)));
			auto index = reinterpret_cast<BlockIndexEntry**>(details::align_for<BlockIndexEntry*>(reinterpret_cast<char*>(entries) + sizeof(BlockIndexEntry) * entryCount));
			if (prev != nullptr) {
				auto prevTail = prev->tail.load(std::memory_order_relaxed);
				auto prevPos = prevTail;
				size_t i = 0;
				do {
					prevPos = (prevPos + 1) & (prev->capacity - 1);
					index[i++] = prev->index[prevPos];
				} while (prevPos != prevTail);
				assert(i == prevCapacity);
			}
			for (size_t i = 0; i != entryCount; ++i) {
				new (entries + i) BlockIndexEntry;
				entries[i].key.store(INVALID_BLOCK_BASE, std::memory_order_relaxed);
				index[prevCapacity + i] = entries + i;
			}
			header->prev = prev;
			header->entries = entries;
			header->index = index;
			header->capacity = nextBlockIndexCapacity;
			header->tail.store((prevCapacity - 1) & (nextBlockIndexCapacity - 1), std::memory_order_relaxed);
			
			blockIndex.store(header, std::memory_order_release);
			
			nextBlockIndexCapacity <<= 1;
			
			return true;
		}